

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> * __thiscall
wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(LegacyScriptPubKeyMan *this,int64_t keypool_id)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  size_type sVar4;
  size_type sVar5;
  WalletBatch *this_00;
  iterator keypool_00;
  reference plVar6;
  long in_RDX;
  long in_RSI;
  ScriptPubKeyMan *in_RDI;
  long in_FS_OFFSET;
  int64_t *index;
  set<long,_std::less<long>,_std::allocator<long>_> *setKeyPool;
  bool internal;
  vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *result;
  WalletBatch batch;
  iterator it;
  CKeyPool keypool;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  WalletDatabase *in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  const_iterator in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  ScriptPubKeyMan *this_01;
  ConstevalFormatString<1U> in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffeb8._M_node,(char *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac,(AnnotatedMixin<std::recursive_mutex> *)0x16699ae);
  sVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::count
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)
                     in_stack_fffffffffffffeb8._M_node,
                     (key_type_conflict4 *)in_stack_fffffffffffffeb0);
  if (sVar4 == 0) {
    sVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::count
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       in_stack_fffffffffffffeb8._M_node,
                       (key_type_conflict4 *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffef7 = true;
    if (sVar5 == 0) {
      sVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::count
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffeb8._M_node,
                         (key_type_conflict4 *)in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffef7 = sVar5 != 0;
    }
    if ((bool)in_stack_fffffffffffffef7 == false) {
      __assert_fail("setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x5ec,
                    "std::vector<CKeyPool> wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t)"
                   );
    }
  }
  if (sVar4 == 0) {
    bVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::empty
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (bVar2) {
      in_stack_fffffffffffffee0 = in_RSI + 0x290;
    }
    else {
      in_stack_fffffffffffffee0 = in_RSI + 0x2c0;
    }
  }
  std::set<long,_std::less<long>,_std::allocator<long>_>::begin
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::vector
            ((vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  this_00 = (WalletBatch *)(**(code **)(**(long **)(in_RSI + 8) + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)in_stack_fffffffffffffeb8._M_node,in_stack_fffffffffffffeb0,
             SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0));
  while( true ) {
    keypool_00 = std::end<std::set<long,std::less<long>,std::allocator<long>>>
                           ((set<long,_std::less<long>,_std::allocator<long>_> *)
                            in_stack_fffffffffffffeb0);
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffeb8._M_node,
                            (_Self *)in_stack_fffffffffffffeb0);
    if ((((bVar2 ^ 0xffU) & 1) == 0) ||
       (plVar6 = std::_Rb_tree_const_iterator<long>::operator*
                           ((_Rb_tree_const_iterator<long> *)
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
       in_RDX < *plVar6)) break;
    CKeyPool::CKeyPool((CKeyPool *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    uVar3 = WalletBatch::ReadPool(this_00,in_stack_fffffffffffffee0,(CKeyPool *)keypool_00._M_node);
    if ((bool)uVar3) {
      in_stack_fffffffffffffec0._M_node = (_Base_ptr)(in_RSI + 0x2f8);
      CPubKey::GetID((CPubKey *)keypool_00._M_node);
      std::map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
      erase((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_> *
            )in_stack_fffffffffffffeb8._M_node,(key_type *)in_stack_fffffffffffffeb0);
    }
    LearnAllRelatedScripts
              ((LegacyScriptPubKeyMan *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(CPubKey *)0x1669c57);
    WalletBatch::ErasePool
              ((WalletBatch *)CONCAT17(uVar3,in_stack_fffffffffffffec8),(int64_t)keypool_00._M_node)
    ;
    ScriptPubKeyMan::WalletLogPrintf<long>
              (this_01,in_stack_ffffffffffffff28,
               (long *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    in_stack_fffffffffffffeb8 =
         std::set<long,std::less<long>,std::allocator<long>>::erase_abi_cxx11_
                   ((set<long,_std::less<long>,_std::allocator<long>_> *)
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                    in_stack_fffffffffffffec0);
    std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::push_back
              ((vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(value_type *)0x1669ced
              );
  }
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CKeyPool> LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t keypool_id)
{
    AssertLockHeld(cs_KeyStore);
    bool internal = setInternalKeyPool.count(keypool_id);
    if (!internal) assert(setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id));
    std::set<int64_t> *setKeyPool = internal ? &setInternalKeyPool : (set_pre_split_keypool.empty() ? &setExternalKeyPool : &set_pre_split_keypool);
    auto it = setKeyPool->begin();

    std::vector<CKeyPool> result;
    WalletBatch batch(m_storage.GetDatabase());
    while (it != std::end(*setKeyPool)) {
        const int64_t& index = *(it);
        if (index > keypool_id) break; // set*KeyPool is ordered

        CKeyPool keypool;
        if (batch.ReadPool(index, keypool)) { //TODO: This should be unnecessary
            m_pool_key_to_index.erase(keypool.vchPubKey.GetID());
        }
        LearnAllRelatedScripts(keypool.vchPubKey);
        batch.ErasePool(index);
        WalletLogPrintf("keypool index %d removed\n", index);
        it = setKeyPool->erase(it);
        result.push_back(std::move(keypool));
    }

    return result;
}